

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_specialspot.cpp
# Opt level: O3

bool __thiscall FSpotList::Add(FSpotList *this,ASpecialSpot *newspot)

{
  ulong uVar1;
  uint uVar2;
  ASpecialSpot **ppAVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  uVar5 = (ulong)(this->Spots).Count;
  if (uVar5 == 0) {
LAB_004bbcdd:
    TArray<ASpecialSpot_*,_ASpecialSpot_*>::Grow(&this->Spots,1);
    uVar2 = (this->Spots).Count;
    (this->Spots).Array[uVar2] = newspot;
    (this->Spots).Count = uVar2 + 1;
    bVar7 = true;
  }
  else {
    ppAVar3 = (this->Spots).Array;
    if (*ppAVar3 == newspot) {
      bVar7 = false;
    }
    else {
      uVar6 = 0;
      do {
        if (uVar5 - 1 == uVar6) goto LAB_004bbcdd;
        uVar1 = uVar6 + 1;
        lVar4 = uVar6 + 1;
        uVar6 = uVar1;
      } while (ppAVar3[lVar4] != newspot);
      bVar7 = uVar5 <= uVar1;
    }
  }
  return bVar7;
}

Assistant:

bool Add(ASpecialSpot *newspot)
	{
		for(unsigned i = 0; i < Spots.Size(); i++)
		{
			if (Spots[i] == newspot) return false;
		}
		Spots.Push(newspot);
		return true;
	}